

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CheckStructure.cpp
# Opt level: O0

bool __thiscall CheckStructure::isOpenedPar(CheckStructure *this,string *ch)

{
  __type _Var1;
  reference pvVar2;
  allocator local_41;
  string local_40 [32];
  string *local_20;
  string *ch_local;
  CheckStructure *this_local;
  
  local_20 = ch;
  ch_local = &this->m_sMainType;
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&this->delimiters,0);
  _Var1 = std::operator==(ch,pvVar2);
  if (_Var1) {
    this_local._7_1_ = true;
  }
  else {
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->delimiters,5);
    _Var1 = std::operator==(ch,pvVar2);
    if (_Var1) {
      this->m_countCalls = this->m_countCalls + 1;
      this_local._7_1_ = true;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_40,"wrong char instead of open parentness",&local_41);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->m_errors,(value_type *)local_40);
      std::__cxx11::string::~string(local_40);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool CheckStructure::isOpenedPar(string ch) {
    if (ch == delimiters[0])
        return true;
    if (ch == delimiters[5]) {
        m_countCalls++;
        return true;
    }
    m_errors.push_back("wrong char instead of open parentness");
    return false;
}